

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

void rb_rotate_right(rb_node **rbt,rb_node *rbn)

{
  rb_node *prVar1;
  rb_node *prVar2;
  
  prVar1 = rbn->left;
  prVar2 = prVar1->right;
  rbn->left = prVar2;
  if (prVar2 != (rb_node *)0x0) {
    prVar2->parent = rbn;
  }
  prVar2 = rbn->parent;
  prVar1->parent = prVar2;
  if (prVar2 != (rb_node *)0x0) {
    rbt = &prVar2->right;
    if (prVar2->left == rbn) {
      rbt = &prVar2->left;
    }
  }
  *rbt = prVar1;
  prVar1->right = rbn;
  rbn->parent = prVar1;
  return;
}

Assistant:

static void
rb_rotate_right(struct rb_node **rbt, struct rb_node *rbn)
{
    struct rb_node *parent;
    struct rb_node *tmp;

    tmp = RBN_LEFT(rbn);
    RBN_LEFT(rbn) = RBN_RIGHT(tmp);
    if (RBN_LEFT(rbn) != NULL) {
        RBN_PARENT(RBN_RIGHT(tmp)) = rbn;
    }

    parent = RBN_PARENT(rbn);
    RBN_PARENT(tmp) = parent;
    if (parent != NULL) {
        if (rbn == RBN_LEFT(parent)) {
            RBN_LEFT(parent) = tmp;
        } else {
            RBN_RIGHT(parent) = tmp;
        }
    } else {
        *rbt = tmp;
    }

    RBN_RIGHT(tmp) = rbn;
    RBN_PARENT(rbn) = tmp;
}